

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateGetEnumDescriptorSpecializations
          (EnumGenerator *this,Printer *printer)

{
  Printer *this_00;
  bool bVar1;
  FileDescriptor *file;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  file = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(file);
  this_00 = local_18;
  if (bVar1) {
    ClassName_abi_cxx11_(&local_38,(cpp *)this->descriptor_,(EnumDescriptor *)0x1,SUB81(local_18,0))
    ;
    io::Printer::Print(this_00,
                       "template <>\ninline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n  return $classname$_descriptor();\n}\n"
                       ,"classname",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void EnumGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "template <>\n"
      "inline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n"
      "  return $classname$_descriptor();\n"
      "}\n",
      "classname", ClassName(descriptor_, true));
  }
}